

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmsdemo.cpp
# Opt level: O1

int main(int param_1,char **param_2)

{
  double dVar1;
  int iVar2;
  FILE *pFVar3;
  FILE *__stream;
  double *pdVar4;
  double *coeff_end;
  double *pdVar5;
  int i;
  int iVar6;
  ulong uVar7;
  double *pdVar8;
  double *pdVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double input_signal;
  Fir1 fir;
  double local_58;
  Fir1 local_50;
  
  Fir1::Fir1(&local_50,100,0.0);
  local_50.mu = 0.0005;
  pFVar3 = fopen("ecg50hz.dat","rt");
  __stream = fopen("ecg_filtered.dat","wt");
  iVar6 = 0;
  while (iVar2 = __isoc99_fscanf(pFVar3,"%lf\n",&local_58), 0 < iVar2) {
    dVar10 = sin((double)iVar6 * 0.3141592653589793);
    uVar7 = (ulong)local_50.taps;
    pdVar5 = local_50.buffer + local_50.offset;
    *pdVar5 = dVar10;
    dVar12 = 0.0;
    pdVar9 = local_50.coefficients;
    do {
      dVar11 = *pdVar5;
      dVar1 = *pdVar9;
      pdVar5 = pdVar5 + -1;
      pdVar9 = pdVar9 + 1;
      dVar12 = dVar12 + dVar11 * dVar1;
    } while (local_50.buffer <= pdVar5);
    pdVar5 = local_50.coefficients + uVar7;
    if (pdVar9 < pdVar5) {
      pdVar4 = local_50.buffer + uVar7;
      do {
        pdVar4 = pdVar4 + -1;
        dVar11 = *pdVar9;
        pdVar9 = pdVar9 + 1;
        dVar12 = dVar12 + *pdVar4 * dVar11;
      } while (pdVar9 < pdVar5);
    }
    pdVar9 = local_50.buffer + uVar7;
    local_50.offset = local_50.offset + 1;
    if (local_50.taps <= local_50.offset) {
      local_50.offset = 0;
    }
    dVar11 = local_58 - dVar12;
    pdVar8 = local_50.buffer + local_50.offset;
    pdVar4 = local_50.coefficients;
    do {
      dVar1 = *pdVar8;
      pdVar8 = pdVar8 + -1;
      *pdVar4 = dVar1 * dVar11 * local_50.mu + *pdVar4;
      pdVar4 = pdVar4 + 1;
    } while (local_50.buffer <= pdVar8);
    for (; pdVar4 < pdVar5; pdVar4 = pdVar4 + 1) {
      pdVar9 = pdVar9 + -1;
      *pdVar4 = *pdVar9 * dVar11 * local_50.mu + *pdVar4;
    }
    fprintf(__stream,"%f %f %f\n",dVar11,dVar12,dVar10);
    iVar6 = iVar6 + 1;
  }
  main_cold_1();
  return 0;
}

Assistant:

int main (int,char**)
{
	// inits the filter
	Fir1 fir(NTAPS);
	fir.setLearningRate(LEARNING_RATE);

	FILE *finput = fopen("ecg50hz.dat","rt");
	FILE *foutput = fopen("ecg_filtered.dat","wt");
	for(int i=0;;i++) 
	{
		double input_signal;		
		if (fscanf(finput,"%lf\n",&input_signal)<1) break;
		double ref_noise = sin(2*M_PI/20*i);
		double canceller = fir.filter(ref_noise);
		double output_signal = input_signal - canceller;
		fir.lms_update(output_signal);
		fprintf(foutput,"%f %f %f\n",output_signal,canceller,ref_noise);
	}
	fclose(finput);
	fclose(foutput);
	fprintf(stderr,"Written the filtered ECG to 'ecg_filtered.dat'\n");
}